

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::computeDualfarkas4Row
          (SPxSolverBase<double> *this,double direction,SPxId enterId)

{
  uint uVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  UpdateVector<double> *pUVar5;
  IdxSet *this_00;
  DataKey *pDVar6;
  int __c;
  SPxSolverBase<double> *in_RDI;
  double in_XMM0_Qa;
  SPxId spxid;
  int j;
  double sign;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  SPxLPBase<double> *in_stack_ffffffffffffff70;
  SPxLPBase<double> *this_01;
  DSVectorBase<double> *in_stack_ffffffffffffff78;
  int i;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  SPxRowId local_48;
  double local_40;
  SPxRowId local_34;
  DataKey local_2c;
  uint local_24;
  double local_20;
  SPxId local_8;
  
  local_20 = (double)(~-(ulong)(0.0 < in_XMM0_Qa) & 0x3ff0000000000000 |
                     (ulong)((uint)(-(ulong)(0.0 < in_XMM0_Qa) >> 0x20) & 0xbff00000) << 0x20);
  SVectorBase<double>::clear((SVectorBase<double> *)0x243713);
  pUVar5 = fVec(in_RDI);
  UpdateVector<double>::delta(pUVar5);
  SSVectorBase<double>::size((SSVectorBase<double> *)0x24373b);
  DSVectorBase<double>::setMax
            ((DSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  local_24 = 0;
  while( true ) {
    uVar1 = local_24;
    pUVar5 = fVec(in_RDI);
    UpdateVector<double>::delta(pUVar5);
    iVar4 = SSVectorBase<double>::size((SSVectorBase<double> *)0x243774);
    i = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (iVar4 <= (int)uVar1) break;
    fVec(in_RDI);
    this_00 = UpdateVector<double>::idx((UpdateVector<double> *)0x2437a2);
    IdxSet::index(this_00,(char *)(ulong)local_24,__c);
    pDVar6 = &SPxBasisBase<double>::baseId
                        ((SPxBasisBase<double> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c
                        )->super_DataKey;
    local_2c = *pDVar6;
    bVar3 = SPxId::isSPxRowId((SPxId *)&local_2c);
    if (bVar3) {
      in_stack_ffffffffffffff78 = &in_RDI->dualFarkas;
      SPxRowId::SPxRowId(&local_34,(SPxId *)&local_2c);
      in_stack_ffffffffffffff84 =
           SPxLPBase<double>::number
                     (in_stack_ffffffffffffff70,
                      (SPxRowId *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      dVar2 = local_20;
      pUVar5 = fVec(in_RDI);
      UpdateVector<double>::delta(pUVar5);
      local_40 = SSVectorBase<double>::value
                           ((SSVectorBase<double> *)in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff6c);
      local_40 = dVar2 * local_40;
      DSVectorBase<double>::add
                ((DSVectorBase<double> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(double *)in_stack_ffffffffffffff70
                );
    }
    local_24 = local_24 + 1;
  }
  bVar3 = SPxId::isSPxRowId(&local_8);
  if (bVar3) {
    this_01 = (SPxLPBase<double> *)&in_RDI->dualFarkas;
    SPxRowId::SPxRowId(&local_48,&local_8);
    SPxLPBase<double>::number
              (this_01,(SPxRowId *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    DSVectorBase<double>::add
              ((DSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,i,(double *)this_01);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}